

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

TestBuilder * __thiscall
anon_unknown.dwarf_af3cfc::TestBuilder::Push(TestBuilder *this,CScript *_script)

{
  long lVar1;
  const_iterator this_00;
  TestBuilder *in_RDI;
  long in_FS_OFFSET;
  allocator<unsigned_char> *in_stack_ffffffffffffff88;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff90;
  allocator_type *in_stack_ffffffffffffffb0;
  const_iterator __last;
  const_iterator in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __last.ptr = (uchar *)in_RDI;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_ffffffffffffff90);
  this_00 = prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff90);
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff88);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00.ptr,
             in_stack_ffffffffffffffd8,__last,in_stack_ffffffffffffffb0);
  DoPush(in_RDI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& Push(const CScript& _script)
    {
        DoPush(std::vector<unsigned char>(_script.begin(), _script.end()));
        return *this;
    }